

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O2

void free_entry(conf_entry *entry)

{
  int iVar1;
  long lVar2;
  
  lVar2 = (long)(entry->key).primary;
  if (subkeytypes[lVar2] == 3) {
    safefree((entry->key).secondary.s);
    lVar2 = (long)(entry->key).primary;
  }
  iVar1 = valuetypes[lVar2];
  if (iVar1 == 5) {
    fontspec_free((entry->value).u.fontval);
  }
  else if (iVar1 == 4) {
    filename_free((entry->value).u.fileval);
  }
  else if (iVar1 == 3) {
    safefree((entry->value).u.stringval);
  }
  safefree(entry);
  return;
}

Assistant:

static void free_entry(struct conf_entry *entry)
{
    free_key(&entry->key);
    free_value(&entry->value, valuetypes[entry->key.primary]);
    sfree(entry);
}